

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

int mbedtls_gcm_finish(mbedtls_gcm_context *ctx,uchar *tag,size_t tag_len)

{
  uchar *x;
  uchar *puVar1;
  size_t sVar2;
  long lVar3;
  long lVar4;
  uchar work_buf [16];
  byte abStack_1c0 [384];
  undefined8 uStack_40;
  byte local_38 [16];
  
  if (tag_len - 0x11 < 0xfffffffffffffff3) {
    return -0x14;
  }
  lVar3 = ctx->len << 3;
  lVar4 = ctx->add_len << 3;
  uStack_40 = 0x130e1a;
  memcpy(tag,ctx->base_ectr,tag_len);
  if (lVar3 != 0 || lVar4 != 0) {
    local_38[0] = (char)((ulong)lVar4 >> 0x38);
    local_38[1] = (char)((ulong)lVar4 >> 0x30);
    local_38[2] = (char)((ulong)lVar4 >> 0x28);
    local_38[3] = (char)((ulong)lVar4 >> 0x20);
    local_38[4] = (char)((ulong)lVar4 >> 0x18);
    local_38[5] = (char)((ulong)lVar4 >> 0x10);
    local_38[6] = (char)((ulong)lVar4 >> 8);
    local_38[7] = (char)lVar4;
    local_38[8] = (char)((ulong)lVar3 >> 0x38);
    local_38[9] = (char)((ulong)lVar3 >> 0x30);
    local_38[10] = (char)((ulong)lVar3 >> 0x28);
    local_38[0xb] = (char)((ulong)lVar3 >> 0x20);
    local_38[0xc] = (char)((ulong)lVar3 >> 0x18);
    local_38[0xd] = (char)((ulong)lVar3 >> 0x10);
    local_38[0xe] = (char)((ulong)lVar3 >> 8);
    local_38[0xf] = (char)lVar3;
    x = ctx->buf;
    for (lVar3 = 0x188; lVar3 != 0x198; lVar3 = lVar3 + 1) {
      puVar1 = (ctx->cipher_ctx).unprocessed_data + lVar3 + -0x20;
      *puVar1 = *puVar1 ^ abStack_1c0[lVar3];
    }
    uStack_40 = 0x130eee;
    gcm_mult(ctx,x,x);
    for (sVar2 = 0; tag_len != sVar2; sVar2 = sVar2 + 1) {
      tag[sVar2] = tag[sVar2] ^ x[sVar2];
    }
  }
  return 0;
}

Assistant:

int mbedtls_gcm_finish( mbedtls_gcm_context *ctx,
                unsigned char *tag,
                size_t tag_len )
{
    unsigned char work_buf[16];
    size_t i;
    uint64_t orig_len = ctx->len * 8;
    uint64_t orig_add_len = ctx->add_len * 8;

    if( tag_len > 16 || tag_len < 4 )
        return( MBEDTLS_ERR_GCM_BAD_INPUT );

    memcpy( tag, ctx->base_ectr, tag_len );

    if( orig_len || orig_add_len )
    {
        memset( work_buf, 0x00, 16 );

        PUT_UINT32_BE( ( orig_add_len >> 32 ), work_buf, 0  );
        PUT_UINT32_BE( ( orig_add_len       ), work_buf, 4  );
        PUT_UINT32_BE( ( orig_len     >> 32 ), work_buf, 8  );
        PUT_UINT32_BE( ( orig_len           ), work_buf, 12 );

        for( i = 0; i < 16; i++ )
            ctx->buf[i] ^= work_buf[i];

        gcm_mult( ctx, ctx->buf, ctx->buf );

        for( i = 0; i < tag_len; i++ )
            tag[i] ^= ctx->buf[i];
    }

    return( 0 );
}